

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

ChVariablesBodySharedMass * __thiscall
chrono::ChVariablesBodySharedMass::operator=
          (ChVariablesBodySharedMass *this,ChVariablesBodySharedMass *other)

{
  if (other != this) {
    ChVariablesBody::operator=(&this->super_ChVariablesBody,&other->super_ChVariablesBody);
    this->sharedmass = other->sharedmass;
  }
  return this;
}

Assistant:

ChVariablesBodySharedMass& ChVariablesBodySharedMass::operator=(const ChVariablesBodySharedMass& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariablesBody::operator=(other);

    // copy class data
    sharedmass = other.sharedmass;

    return *this;
}